

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::TextureCubeFilteringCase::iterate(TextureCubeFilteringCase *this)

{
  float *pfVar1;
  TextureFormat TVar2;
  ulong uVar3;
  size_t *psVar4;
  Vec4 *pVVar5;
  ostringstream *this_00;
  deUint32 dVar6;
  TestLog *log;
  pointer pFVar7;
  RenderContext *context;
  TextureCube *pTVar8;
  pointer pFVar9;
  bool bVar10;
  int i;
  int iVar11;
  deUint32 dVar12;
  SamplerType SVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar14;
  TextureFormat *pTVar15;
  size_t sVar16;
  undefined4 extraout_var_01;
  long lVar17;
  NotSupportedError *this_01;
  char *pcVar18;
  int iVar19;
  qpTestResult testResult;
  ulong uVar20;
  pointer pfVar21;
  TestContext *pTVar22;
  uint uVar23;
  void *pvVar24;
  CubeFace face;
  TextureCube *format;
  Surface result;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  LookupPrecision local_348;
  PixelFormat pixelFormat;
  LodPrecision lodPrecision;
  undefined1 local_2f8 [8];
  TextureFormat TStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [2];
  long local_2c8;
  ScopedLogSection iterSection;
  TextureFormatInfo fmtInfo;
  ReferenceParams sampleParams;
  IVec4 colorBits;
  Vector<int,_4> res;
  undefined4 uStack_184;
  DepthStencilMode DStack_180;
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  iVar11 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar17 = CONCAT44(extraout_var,iVar11);
  iVar11 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar12 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  uVar23 = ((uint)this->m_caseNdx >> 0x10 ^ this->m_caseNdx ^ 0x3d) * 9;
  uVar23 = (uVar23 >> 4 ^ uVar23) * 0x27d4eb2d;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar11),0x1c,0x1c,
             uVar23 >> 0xf ^ dVar12 ^ uVar23);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  pVVar5 = &fmtInfo.valueMax;
  fmtInfo.valueMin.m_data._0_8_ = pVVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&fmtInfo,"Test","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_148);
  uVar3 = CONCAT44(local_348.uvwBits.m_data[0],local_348.coordBits.m_data[2]) +
          fmtInfo.valueMin.m_data._8_8_;
  uVar20 = 0xf;
  if ((Vec4 *)fmtInfo.valueMin.m_data._0_8_ != pVVar5) {
    uVar20 = fmtInfo.valueMax.m_data._0_8_;
  }
  if (uVar20 < uVar3) {
    uVar20 = 0xf;
    if ((int *)local_348.coordBits.m_data._0_8_ != local_348.uvwBits.m_data + 1) {
      uVar20 = CONCAT44(local_348.uvwBits.m_data[2],local_348.uvwBits.m_data[1]);
    }
    if (uVar20 < uVar3) goto LAB_01146469;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_348,0,(char *)0x0,fmtInfo.valueMin.m_data._0_8_);
  }
  else {
LAB_01146469:
    puVar14 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&fmtInfo,local_348.coordBits.m_data._0_8_);
  }
  sampleParams.super_RenderParams._0_8_ = sampleParams.super_RenderParams.w.m_data + 1;
  pfVar1 = (float *)(puVar14 + 2);
  if ((float *)*puVar14 == pfVar1) {
    sampleParams.super_RenderParams.w.m_data._4_8_ = *(undefined8 *)pfVar1;
    sampleParams.super_RenderParams.w.m_data[3] = *(float *)(puVar14 + 3);
    sampleParams.super_RenderParams.bias = *(float *)((long)puVar14 + 0x1c);
  }
  else {
    sampleParams.super_RenderParams.w.m_data._4_8_ = *(undefined8 *)pfVar1;
    sampleParams.super_RenderParams._0_8_ = (float *)*puVar14;
  }
  sampleParams.super_RenderParams._8_8_ = puVar14[1];
  *puVar14 = pfVar1;
  puVar14[1] = 0;
  *(undefined1 *)pfVar1 = 0;
  psVar4 = &result.m_pixels.m_cap;
  result._0_8_ = psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"Test ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_148);
  pfVar21 = (pointer)0xf;
  if ((size_t *)result._0_8_ != psVar4) {
    pfVar21 = (pointer)result.m_pixels.m_cap;
  }
  if (pfVar21 < (pointer)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish + (long)result.m_pixels.m_ptr)) {
    pfVar21 = (pointer)0xf;
    if ((pointer *)
        texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      pfVar21 = texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    }
    if ((pointer)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish + (long)result.m_pixels.m_ptr) <= pfVar21)
    {
      pTVar15 = (TextureFormat *)
                std::__cxx11::string::replace((ulong)&texCoord,0,(char *)0x0,result._0_8_);
      goto LAB_011465b8;
    }
  }
  pTVar15 = (TextureFormat *)
            std::__cxx11::string::_M_append
                      ((char *)&result,
                       (ulong)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
LAB_011465b8:
  local_2f8 = (undefined1  [8])local_2e8;
  TVar2 = (TextureFormat)(pTVar15 + 2);
  if (*pTVar15 == TVar2) {
    local_2e8[0]._0_8_ = *(undefined8 *)TVar2;
    local_2e8[0]._8_8_ = pTVar15[3];
  }
  else {
    local_2e8[0]._0_8_ = *(undefined8 *)TVar2;
    local_2f8 = (undefined1  [8])*pTVar15;
  }
  TStack_2f0 = pTVar15[1];
  *pTVar15 = TVar2;
  pTVar15[1].order = R;
  pTVar15[1].type = SNORM_INT8;
  *(char *)TVar2 = '\0';
  tcu::ScopedLogSection::ScopedLogSection
            (&iterSection,log,(string *)&sampleParams,(string *)local_2f8);
  if (local_2f8 != (undefined1  [8])local_2e8) {
    operator_delete((void *)local_2f8,local_2e8[0]._M_allocated_capacity + 1);
  }
  if ((pointer *)
      texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((size_t *)result._0_8_ != psVar4) {
    operator_delete((void *)result._0_8_,result.m_pixels.m_cap + 1);
  }
  if ((float *)sampleParams.super_RenderParams._0_8_ != sampleParams.super_RenderParams.w.m_data + 1
     ) {
    operator_delete((void *)sampleParams.super_RenderParams._0_8_,
                    sampleParams.super_RenderParams.w.m_data._4_8_ + 1);
  }
  if ((int *)local_348.coordBits.m_data._0_8_ != local_348.uvwBits.m_data + 1) {
    operator_delete((void *)local_348.coordBits.m_data._0_8_,
                    CONCAT44(local_348.uvwBits.m_data[2],local_348.uvwBits.m_data[1]) + 1);
  }
  if ((Vec4 *)fmtInfo.valueMin.m_data._0_8_ != pVVar5) {
    operator_delete((void *)fmtInfo.valueMin.m_data._0_8_,fmtInfo.valueMax.m_data._0_8_ + 1);
  }
  iVar11 = this->m_caseNdx;
  pFVar7 = (this->m_cases).
           super__Vector_base<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  format = &(pFVar7[iVar11].texture)->m_refTexture;
  tcu::getTextureFormatInfo(&fmtInfo,&format->m_format);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&sampleParams,TEXTURETYPE_CUBE);
  if ((viewport.width < 0x1c) || (viewport.height < 0x1c)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small render target",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
               ,0x23b);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pFVar7 = pFVar7 + iVar11;
  (**(code **)(lVar17 + 0xb8))(0x8513,pFVar7->texture->m_glTexture);
  (**(code **)(lVar17 + 0x1360))(0x8513,0x2801,this->m_minFilter);
  (**(code **)(lVar17 + 0x1360))(0x8513,0x2800,this->m_magFilter);
  (**(code **)(lVar17 + 0x1360))(0x8513,0x2802,this->m_wrapS);
  (**(code **)(lVar17 + 0x1360))(0x8513,0x2803,this->m_wrapT);
  (**(code **)(lVar17 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  glu::mapGLSampler((Sampler *)&res,0x812f,0x812f,this->m_minFilter,this->m_magFilter);
  sampleParams.sampler.wrapS = res.m_data[0];
  sampleParams.sampler.wrapT = res.m_data[1];
  sampleParams.sampler.wrapR = res.m_data[2];
  sampleParams.sampler.minFilter = res.m_data[3];
  sampleParams.sampler._53_7_ = SUB87(CONCAT44(DStack_180,uStack_184) >> 8,0);
  sampleParams.sampler.seamlessCubeMap = true;
  SVar13 = glu::TextureTestUtil::getSamplerType(format->m_format);
  sampleParams.super_RenderParams.samplerType = SVar13;
  sampleParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  sampleParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  sampleParams.super_RenderParams.colorBias.m_data[2] = fmtInfo.lookupBias.m_data[2];
  sampleParams.super_RenderParams.colorBias.m_data[3] = fmtInfo.lookupBias.m_data[3];
  sampleParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  sampleParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  sampleParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  sampleParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  sampleParams.lodMode = LODMODE_EXACT;
  res.m_data._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(res.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(this_00);
  local_2c8 = lVar17;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Coordinates: ",0xd);
  tcu::operator<<((ostream *)this_00,&pFVar7->bottomLeft);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," -> ",4);
  tcu::operator<<((ostream *)this_00,&pFVar7->topRight);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_140);
  face = CUBEFACE_NEGATIVE_X;
  do {
    tcu::Surface::Surface(&result,viewport.width,viewport.height);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    glu::TextureTestUtil::computeQuadTexCoordCube
              (&texCoord,face,&pFVar7->bottomLeft,&pFVar7->topRight);
    res.m_data._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(res.m_data + 2));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(res.m_data + 2),"Face ",5);
    switch(face) {
    case CUBEFACE_NEGATIVE_X:
      bVar10 = false;
      pcVar18 = "-X";
      break;
    case CUBEFACE_POSITIVE_X:
      bVar10 = false;
      pcVar18 = "+X";
      break;
    case CUBEFACE_NEGATIVE_Y:
      bVar10 = false;
      pcVar18 = "-Y";
      break;
    case CUBEFACE_POSITIVE_Y:
      bVar10 = false;
      pcVar18 = "+Y";
      break;
    case CUBEFACE_NEGATIVE_Z:
      bVar10 = false;
      pcVar18 = "-Z";
      break;
    case CUBEFACE_POSITIVE_Z:
      bVar10 = false;
      pcVar18 = "+Z";
      break;
    default:
      bVar10 = true;
      pcVar18 = (char *)0x0;
    }
    if (bVar10) {
      std::ios::clear((int)(res.m_data + 2) + (int)*(undefined8 *)(res.m_data._8_8_ + -0x18));
    }
    else {
      sVar16 = strlen(pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(res.m_data + 2),pcVar18,sVar16)
      ;
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(res.m_data + 2));
    std::ios_base::~ios_base(local_140);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,&sampleParams.super_RenderParams);
    dVar12 = (**(code **)(local_2c8 + 0x800))();
    glu::checkError(dVar12,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
                    ,0x25e);
    iVar19 = viewport.y;
    iVar11 = viewport.x;
    context = this->m_renderCtx;
    local_348.coordBits.m_data[0] = 8;
    local_348.coordBits.m_data[1] = 3;
    pvVar24 = (void *)result.m_pixels.m_cap;
    if (result.m_pixels.m_cap != 0) {
      pvVar24 = result.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&res,(TextureFormat *)&local_348,result.m_width,result.m_height,
               1,pvVar24);
    glu::readPixels(context,iVar11,iVar19,(PixelBufferAccess *)&res);
    dVar12 = (**(code **)(local_2c8 + 0x800))();
    glu::checkError(dVar12,"Read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
                    ,0x261);
    dVar12 = this->m_minFilter;
    dVar6 = this->m_magFilter;
    iVar11 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    pixelFormat._0_8_ = *(undefined8 *)(CONCAT44(extraout_var_01,iVar11) + 8);
    pixelFormat._8_8_ = *(undefined8 *)(CONCAT44(extraout_var_01,iVar11) + 0x10);
    local_348.coordBits.m_data[0] = pixelFormat.redBits;
    local_348.coordBits.m_data[1] = pixelFormat.greenBits;
    local_348.coordBits.m_data[2] = pixelFormat.blueBits;
    local_348.uvwBits.m_data[0] = pixelFormat.alphaBits;
    res.m_data[0] = 0;
    res.m_data[1] = 0;
    res.m_data[2] = 0;
    res.m_data[3] = 0;
    lVar17 = 0;
    do {
      res.m_data[lVar17] =
           local_348.coordBits.m_data[lVar17] + ((dVar6 == 0x2600 && dVar12 == 0x2600) | 0xfffffffe)
      ;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    local_2f8._0_4_ = R;
    local_2f8._4_4_ = SNORM_INT8;
    TStack_2f0.order = R;
    TStack_2f0.type = SNORM_INT8;
    colorBits.m_data[0] = 0;
    colorBits.m_data[1] = 0;
    colorBits.m_data[2] = 0;
    colorBits.m_data[3] = 0;
    lVar17 = 0;
    do {
      iVar11 = *(int *)(local_2f8 + lVar17 * 4);
      if (*(int *)(local_2f8 + lVar17 * 4) < res.m_data[lVar17]) {
        iVar11 = res.m_data[lVar17];
      }
      colorBits.m_data[lVar17] = iVar11;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    lodPrecision.rule = RULE_OPENGL;
    lVar17 = 0;
    do {
      local_348.coordBits.m_data[lVar17] = 0x16;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    lVar17 = 3;
    do {
      local_348.coordBits.m_data[lVar17] = 0x10;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 6);
    local_348.colorThreshold.m_data[0] = 0.0;
    local_348.colorThreshold.m_data[1] = 0.0;
    local_348.colorThreshold.m_data[2] = 0.0;
    local_348.colorThreshold.m_data[3] = 0.0;
    local_348.colorMask.m_data[0] = true;
    local_348.colorMask.m_data[1] = true;
    local_348.colorMask.m_data[2] = true;
    local_348.colorMask.m_data[3] = true;
    lodPrecision.derivateBits = 10;
    lodPrecision.lodBits = 5;
    tcu::computeFixedPointThreshold((tcu *)local_2f8,&colorBits);
    res.m_data[0] = 0;
    res.m_data[1] = 0;
    res.m_data[2] = 0;
    res.m_data[3] = 0;
    lVar17 = 0;
    do {
      res.m_data[lVar17] =
           (int)(*(float *)(local_2f8 + lVar17 * 4) /
                sampleParams.super_RenderParams.colorScale.m_data[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    local_348.colorThreshold.m_data[0] = (float)res.m_data[0];
    local_348.colorThreshold.m_data[1] = (float)res.m_data[1];
    local_348.colorThreshold.m_data[2] = (float)res.m_data[2];
    local_348.colorThreshold.m_data[3] = (float)res.m_data[3];
    local_348.coordBits.m_data._0_8_ = (undefined1 *)0xa0000000a;
    local_348.coordBits.m_data[2] = 10;
    local_348.uvwBits.m_data[0] = 6;
    local_348.uvwBits.m_data[1] = 6;
    local_348.uvwBits.m_data[2] = 0;
    local_348.colorMask.m_data[1] = 0 < pixelFormat.greenBits;
    local_348.colorMask.m_data[0] = 0 < pixelFormat.redBits;
    local_348.colorMask.m_data[2] = 0 < pixelFormat.blueBits;
    local_348.colorMask.m_data[3] = 0 < pixelFormat.alphaBits;
    pTVar22 = (this->super_TestCase).super_TestNode.m_testCtx;
    res.m_data[0] = 8;
    res.m_data[1] = 3;
    pvVar24 = (void *)result.m_pixels.m_cap;
    if (result.m_pixels.m_cap != 0) {
      pvVar24 = result.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_2f8,(TextureFormat *)&res,result.m_width,result.m_height,1
               ,pvVar24);
    pTVar8 = pFVar7->texture;
    res.m_data[0] = (pTVar8->m_refTexture).m_view.m_numLevels;
    res.m_data[1] = *(int *)&(pTVar8->m_refTexture).m_view.field_0x4;
    res.m_data._8_8_ = (pTVar8->m_refTexture).m_view.m_levels[0];
    bVar10 = glu::TextureTestUtil::verifyTextureResult
                       (pTVar22,(ConstPixelBufferAccess *)local_2f8,(TextureCubeView *)&res,
                        texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,&sampleParams,&local_348,&lodPrecision,
                        &pixelFormat);
    if (!bVar10) {
      lodPrecision.lodBits = 4;
      local_348.uvwBits.m_data[0] = 4;
      local_348.uvwBits.m_data[1] = 4;
      local_348.uvwBits.m_data[2] = 0;
      res.m_data._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(res.m_data + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(res.m_data + 2),
                 "Warning: Verification against high precision requirements failed, trying with lower requirements."
                 ,0x61);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(res.m_data + 2));
      std::ios_base::~ios_base(local_140);
      pTVar22 = (this->super_TestCase).super_TestNode.m_testCtx;
      res.m_data[0] = 8;
      res.m_data[1] = 3;
      pvVar24 = (void *)result.m_pixels.m_cap;
      if (result.m_pixels.m_cap != 0) {
        pvVar24 = result.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_2f8,(TextureFormat *)&res,result.m_width,result.m_height
                 ,1,pvVar24);
      pTVar8 = pFVar7->texture;
      res.m_data[0] = (pTVar8->m_refTexture).m_view.m_numLevels;
      res.m_data[1] = *(int *)&(pTVar8->m_refTexture).m_view.field_0x4;
      res.m_data._8_8_ = (pTVar8->m_refTexture).m_view.m_levels[0];
      bVar10 = glu::TextureTestUtil::verifyTextureResult
                         (pTVar22,(ConstPixelBufferAccess *)local_2f8,(TextureCubeView *)&res,
                          texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,&sampleParams,&local_348,&lodPrecision,
                          &pixelFormat);
      if (bVar10) {
        pTVar22 = (this->super_TestCase).super_TestNode.m_testCtx;
        if (pTVar22->m_testResult != QP_TEST_RESULT_PASS) goto LAB_01147014;
        testResult = QP_TEST_RESULT_QUALITY_WARNING;
        pcVar18 = "Low-quality filtering result";
      }
      else {
        res.m_data._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(res.m_data + 2));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(res.m_data + 2),
                   "ERROR: Verification against low precision requirements failed, failing test case."
                   ,0x51);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(res.m_data + 2));
        std::ios_base::~ios_base(local_140);
        pTVar22 = (this->super_TestCase).super_TestNode.m_testCtx;
        testResult = QP_TEST_RESULT_FAIL;
        pcVar18 = "Image verification failed";
      }
      tcu::TestContext::setTestResult(pTVar22,testResult,pcVar18);
    }
LAB_01147014:
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&result);
    face = face + CUBEFACE_POSITIVE_X;
    if (face == CUBEFACE_LAST) {
      iVar19 = this->m_caseNdx + 1;
      this->m_caseNdx = iVar19;
      pFVar7 = (this->m_cases).
               super__Vector_base<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar9 = (this->m_cases).
               super__Vector_base<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      tcu::TestLog::endSection(iterSection.m_log);
      iVar11 = (int)((ulong)((long)pFVar9 - (long)pFVar7) >> 3);
      return (IterateResult)
             (SBORROW4(iVar19,iVar11 * -0x55555555) != iVar19 + iVar11 * 0x55555555 < 0);
    }
  } while( true );
}

Assistant:

TextureCubeFilteringCase::IterateResult TextureCubeFilteringCase::iterate (void)
{
	const glw::Functions&			gl				= m_renderCtx.getFunctions();
	const int						viewportSize	= 28;
	const RandomViewport			viewport		(m_renderCtx.getRenderTarget(), viewportSize, viewportSize, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const tcu::ScopedLogSection		iterSection		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	const FilterCase&				curCase			= m_cases[m_caseNdx];
	const tcu::TextureFormat&		texFmt			= curCase.texture->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	ReferenceParams					sampleParams	(TEXTURETYPE_CUBE);

	if (viewport.width < viewportSize || viewport.height < viewportSize)
		throw tcu::NotSupportedError("Too small render target", DE_NULL, __FILE__, __LINE__);

	// Setup texture
	gl.bindTexture	(GL_TEXTURE_CUBE_MAP, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);

	// Other state
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Params for reference computation.
	sampleParams.sampler					= glu::mapGLSampler(GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE, m_minFilter, m_magFilter);
	sampleParams.sampler.seamlessCubeMap	= true;
	sampleParams.samplerType				= getSamplerType(texFmt);
	sampleParams.colorBias					= fmtInfo.lookupBias;
	sampleParams.colorScale					= fmtInfo.lookupScale;
	sampleParams.lodMode					= LODMODE_EXACT;

	m_testCtx.getLog() << TestLog::Message << "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight << TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(viewport.width, viewport.height);
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		m_testCtx.getLog() << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		glu::readPixels(m_renderCtx, viewport.x, viewport.y, result.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

		{
			const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
			const tcu::PixelFormat	pixelFormat		= m_renderCtx.getRenderTarget().getPixelFormat();
			const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
			tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
			tcu::LookupPrecision	lookupPrecision;

			lodPrecision.derivateBits		= 10;
			lodPrecision.lodBits			= 5;
			lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / sampleParams.colorScale;
			lookupPrecision.coordBits		= tcu::IVec3(10,10,10);
			lookupPrecision.uvwBits			= tcu::IVec3(6,6,0);
			lookupPrecision.colorMask		= getCompareMask(pixelFormat);

			const bool isHighQuality = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
														   &texCoord[0], sampleParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				// Evaluate against lower precision requirements.
				lodPrecision.lodBits	= 4;
				lookupPrecision.uvwBits	= tcu::IVec3(4,4,0);

				m_testCtx.getLog() << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

				const bool isOk = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
													  &texCoord[0], sampleParams, lookupPrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				}
				else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality filtering result");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}